

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_50a29::RegexExpr<wchar_t>::parse(RegexExpr<wchar_t> *this,Context *con)

{
  bool bVar1;
  size_t local_28;
  size_t length;
  Context *con_local;
  RegexExpr<wchar_t> *this_local;
  
  length = (size_t)con;
  con_local = (Context *)this;
  bVar1 = regexMatch<wchar_t>((con->position).it,con->finish,&this->r,&local_28);
  if (bVar1) {
    pegmatite::Context::consume((Context *)length,local_28);
  }
  else {
    pegmatite::Context::set_error_pos((Context *)length);
  }
  return bVar1;
}

Assistant:

bool parse(Context &con) const
	{
		size_t length;
		if (regexMatch(con.position.it, con.finish, r, length))
		{
			con.consume(length);
			return true;
		}
		con.set_error_pos();
		return false;
	}